

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa_io.c
# Opt level: O3

int IDAGetAdjDataPointPolynomial(void *ida_mem,int which,sunrealtype *t,int *order,N_Vector y)

{
  sunrealtype *psVar1;
  undefined8 *puVar2;
  int line;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar3 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x32e;
  }
  else if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAadjInit.";
    iVar3 = -0x65;
    error_code = -0x65;
    line = 0x337;
  }
  else {
    if (*(int *)(*(long *)((long)ida_mem + 0x840) + 0x88) == 2) {
      psVar1 = *(sunrealtype **)
                (*(long *)(*(long *)((long)ida_mem + 0x840) + 0x78) + (long)which * 8);
      *t = *psVar1;
      puVar2 = (undefined8 *)psVar1[1];
      if (y != (N_Vector)0x0) {
        N_VScale(0x3ff0000000000000,*puVar2,y);
      }
      *order = *(int *)(puVar2 + 4);
      return 0;
    }
    msgfmt = "This function cannot be called for the specified interp type.";
    iVar3 = -0x16;
    error_code = -0x16;
    line = 0x341;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDAGetAdjDataPointPolynomial",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa_io.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int IDAGetAdjDataPointPolynomial(void* ida_mem, int which, sunrealtype* t,
                                 int* order, N_Vector y)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  IDApolynomialDataMem content;
  /* Is ida_mem valid? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  dt_mem = IDAADJ_mem->dt_mem;

  if (IDAADJ_mem->ia_interpType != IDA_POLYNOMIAL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_WRONG_INTERP);
    return (IDA_ILL_INPUT);
  }

  *t      = dt_mem[which]->t;
  content = (IDApolynomialDataMem)dt_mem[which]->content;

  if (y != NULL) { N_VScale(ONE, content->y, y); }

  *order = content->order;

  return (IDA_SUCCESS);
}